

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::Formatter::make_expanded_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,App *sub,AppFormatMode mode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  ostream *poVar3;
  stringstream out;
  string local_200;
  string local_1e0;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  App::get_display_name_abi_cxx11_(&local_200,sub,true);
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,
                      (char *)CONCAT71(local_200._M_dataplus._M_p._1_7_,
                                       local_200._M_dataplus._M_p._0_1_),local_200._M_string_length)
  ;
  local_1e0._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1e0,1);
  paVar1 = &local_200.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_200._M_dataplus._M_p._1_7_,local_200._M_dataplus._M_p._0_1_) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_200._M_dataplus._M_p._1_7_,local_200._M_dataplus._M_p._0_1_));
  }
  (*(this->super_FormatterBase)._vptr_FormatterBase[9])(&local_200,this,sub);
  sVar2 = (this->super_FormatterBase).description_paragraph_width_;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"  ","");
  detail::streamOutAsParagraph(local_1a8,&local_200,sVar2,&local_1e0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_200._M_dataplus._M_p._1_7_,local_200._M_dataplus._M_p._0_1_) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_200._M_dataplus._M_p._1_7_,local_200._M_dataplus._M_p._0_1_));
  }
  if (((sub->name_)._M_string_length == 0) &&
     ((sub->aliases_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (sub->aliases_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    detail::format_aliases(local_1a8,&sub->aliases_,(this->super_FormatterBase).column_width_ + 2);
  }
  (*(this->super_FormatterBase)._vptr_FormatterBase[4])(&local_200,this,sub);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,
             (char *)CONCAT71(local_200._M_dataplus._M_p._1_7_,local_200._M_dataplus._M_p._0_1_),
             local_200._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_200._M_dataplus._M_p._1_7_,local_200._M_dataplus._M_p._0_1_) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_200._M_dataplus._M_p._1_7_,local_200._M_dataplus._M_p._0_1_));
  }
  make_groups_abi_cxx11_(&local_200,this,sub,mode);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,
             (char *)CONCAT71(local_200._M_dataplus._M_p._1_7_,local_200._M_dataplus._M_p._0_1_),
             local_200._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_200._M_dataplus._M_p._1_7_,local_200._M_dataplus._M_p._0_1_) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_200._M_dataplus._M_p._1_7_,local_200._M_dataplus._M_p._0_1_));
  }
  (*(this->super_FormatterBase)._vptr_FormatterBase[5])(&local_200,this,sub,(ulong)mode);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,
             (char *)CONCAT71(local_200._M_dataplus._M_p._1_7_,local_200._M_dataplus._M_p._0_1_),
             local_200._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_200._M_dataplus._M_p._1_7_,local_200._M_dataplus._M_p._0_1_) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_200._M_dataplus._M_p._1_7_,local_200._M_dataplus._M_p._0_1_));
  }
  (*(this->super_FormatterBase)._vptr_FormatterBase[8])(&local_200,this,sub);
  sVar2 = (this->super_FormatterBase).footer_paragraph_width_;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"");
  detail::streamOutAsParagraph(local_1a8,&local_200,sVar2,&local_1e0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_200._M_dataplus._M_p._1_7_,local_200._M_dataplus._M_p._0_1_) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_200._M_dataplus._M_p._1_7_,local_200._M_dataplus._M_p._0_1_));
  }
  local_200._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_200,1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return local_1c0;
}

Assistant:

CLI11_INLINE std::string Formatter::make_expanded(const App *sub, AppFormatMode mode) const {
    std::stringstream out;
    out << sub->get_display_name(true) << '\n';

    detail::streamOutAsParagraph(
        out, make_description(sub), description_paragraph_width_, "  ");  // Format description as paragraph

    if(sub->get_name().empty() && !sub->get_aliases().empty()) {
        detail::format_aliases(out, sub->get_aliases(), column_width_ + 2);
    }

    out << make_positionals(sub);
    out << make_groups(sub, mode);
    out << make_subcommands(sub, mode);
    detail::streamOutAsParagraph(out, make_footer(sub), footer_paragraph_width_);  // Format footer as paragraph

    out << '\n';
    return out.str();
}